

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O1

char * __thiscall Fl_Input_::expand(Fl_Input_ *this,char *p,char *buf)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *buf_00;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  long lVar15;
  ulong uVar16;
  double extraout_XMM0_Qa;
  int local_48;
  int local_44;
  
  if (((this->super_Fl_Widget).type_ & 7) == 5) {
    lVar13 = 0;
    buf_00 = (byte *)buf;
    do {
      if (this->value_ + this->size_ <= p) break;
      iVar4 = fl_utf8len(*p);
      if (0 < iVar4) {
        l_secret = fl_utf8encode(0x2a,(char *)buf_00);
        lVar13 = lVar13 + l_secret;
      }
      p = (char *)((byte *)p + 1);
      buf_00 = (byte *)(buf + lVar13);
    } while (lVar13 < 0x3fc);
  }
  else {
    lVar13 = 0;
    local_44 = 0;
    local_48 = 0;
    pbVar9 = (byte *)p;
    pbVar11 = (byte *)buf;
    pbVar14 = (byte *)p;
    do {
      pbVar1 = (byte *)(buf + lVar13);
      p = (char *)pbVar14;
      buf_00 = pbVar1;
      if (0x3fb < lVar13) goto LAB_001ba5f9;
      pbVar10 = pbVar9;
      pbVar12 = pbVar11;
      if ((((this->super_Fl_Widget).type_ & 0x10) != 0) &&
         ((this->value_ + this->size_ <= pbVar14 || (iVar4 = isspace((uint)*pbVar14), iVar4 != 0))))
      {
        iVar4 = (this->super_Fl_Widget).w_;
        iVar5 = Fl::box_dw((uint)(this->super_Fl_Widget).box_);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                  (fl_graphics_driver,pbVar11,(ulong)(uint)((int)pbVar1 - (int)pbVar11));
        local_44 = local_44 + (int)extraout_XMM0_Qa;
        pbVar10 = pbVar14;
        pbVar12 = pbVar1;
        if (pbVar9 + 1 < pbVar14) {
          if ((local_48 != 0) &&
             (p = (char *)pbVar9, buf_00 = pbVar11, (iVar4 - iVar5) + -2 < local_44))
          goto LAB_001ba5f9;
          local_48 = local_48 + 1;
        }
      }
      p = (char *)pbVar14;
      buf_00 = pbVar1;
      if (this->value_ + this->size_ <= pbVar14) goto LAB_001ba5f9;
      p = (char *)(pbVar14 + 1);
      bVar2 = *pbVar14;
      if (bVar2 < 0x20 || bVar2 == 0x7f) {
        if (bVar2 == 9) {
          if (((this->super_Fl_Widget).type_ & 7) != 4) {
LAB_001ba5ce:
            *pbVar1 = 0x5e;
            lVar13 = lVar13 + 2;
            pbVar1[1] = bVar2 ^ 0x40;
            goto LAB_001ba5de;
          }
          uVar6 = fl_utf_nb_char((uchar *)buf,(int)lVar13);
          uVar7 = uVar6 + 7;
          if (-1 < (int)uVar6) {
            uVar7 = uVar6;
          }
          lVar15 = lVar13;
          if (lVar13 < 0x3fc) {
            lVar15 = 0x3fb;
          }
          uVar8 = (ulong)(((uVar7 & 0xfffffff8) - uVar6) + 7);
          uVar16 = lVar15 - lVar13;
          if (uVar8 <= (ulong)(lVar15 - lVar13)) {
            uVar16 = uVar8;
          }
          memset(buf + lVar13,0x20,uVar16 + 1);
          lVar13 = lVar13 + uVar16 + 1;
          bVar3 = true;
        }
        else {
          if ((bVar2 != 10) || (((this->super_Fl_Widget).type_ & 7) != 4)) goto LAB_001ba5ce;
          bVar3 = false;
          p = (char *)pbVar14;
        }
      }
      else {
        lVar13 = lVar13 + 1;
        *pbVar1 = bVar2;
LAB_001ba5de:
        bVar3 = true;
      }
      pbVar9 = pbVar10;
      pbVar11 = pbVar12;
      pbVar14 = (byte *)p;
    } while (bVar3);
    buf_00 = (byte *)(buf + lVar13);
  }
LAB_001ba5f9:
  *buf_00 = 0;
  return (char *)(byte *)p;
}

Assistant:

const char* Fl_Input_::expand(const char* p, char* buf) const {
  char* o = buf;
  char* e = buf+(MAXBUF-4);
  const char* lastspace = p;
  char* lastspace_out = o;
  int width_to_lastspace = 0;
  int word_count = 0;
  int word_wrap;
//  const char *pe = p + strlen(p);

  if (input_type()==FL_SECRET_INPUT) {
    while (o<e && p < value_+size_) {
      if (fl_utf8len((char)p[0]) >= 1) {
	l_secret = fl_utf8encode(secret_char, o);
	o += l_secret;
      }
      p++;
    }

  } else while (o<e) {
    if (wrap() && (p >= value_+size_ || isspace(*p & 255))) {
      word_wrap = w() - Fl::box_dw(box()) - 2;
      width_to_lastspace += (int)fl_width(lastspace_out, (int) (o-lastspace_out));
      if (p > lastspace+1) {
	if (word_count && width_to_lastspace > word_wrap) {
	  p = lastspace; o = lastspace_out; break;
	}
	word_count++;
      }
      lastspace = p;
      lastspace_out = o;
    }

    if (p >= value_+size_) break;
    int c = *p++ & 255;
    if (c < ' ' || c == 127) {
      if (c=='\n' && input_type()==FL_MULTILINE_INPUT) {p--; break;}
      if (c == '\t' && input_type()==FL_MULTILINE_INPUT) {
        for (c = fl_utf_nb_char((uchar*)buf, (int) (o-buf))%8; c<8 && o<e; c++) {
          *o++ = ' ';
        }
      } else {
	*o++ = '^';
	*o++ = c ^ 0x40;
      }
    } else {
      *o++ = c;
    }
  }
  *o = 0;
  return p;
}